

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_aux.c
# Opt level: O0

int luaL_execresult(lua_State *L,int stat)

{
  TValue *pTVar1;
  uint local_24;
  int stat_local;
  lua_State *L_local;
  
  if (stat == -1) {
    L_local._0_4_ = luaL_fileresult(L,0,(char *)0x0);
  }
  else {
    if ((char)(((byte)stat & 0x7f) + 1) >> 1 < '\x01') {
      local_24 = stat;
      if ((stat & 0x7fU) == 0) {
        local_24 = (int)(stat & 0xff00U) >> 8;
      }
      if (local_24 == 0) {
        pTVar1 = L->top;
        L->top = pTVar1 + 1;
        pTVar1->u64 = 0xfffeffffffffffff;
      }
      else {
        pTVar1 = L->top;
        L->top = pTVar1 + 1;
        pTVar1->u64 = 0xffffffffffffffff;
      }
      lua_pushlstring(L,"exit",4);
    }
    else {
      local_24 = stat & 0x7f;
      pTVar1 = L->top;
      L->top = pTVar1 + 1;
      pTVar1->u64 = 0xffffffffffffffff;
      lua_pushlstring(L,"signal",6);
    }
    pTVar1 = L->top;
    L->top = pTVar1 + 1;
    pTVar1->n = (double)(int)local_24;
    L_local._0_4_ = 3;
  }
  return (int)L_local;
}

Assistant:

LUALIB_API int luaL_execresult(lua_State *L, int stat)
{
  if (stat != -1) {
#if LJ_TARGET_POSIX
    if (WIFSIGNALED(stat)) {
      stat = WTERMSIG(stat);
      setnilV(L->top++);
      lua_pushliteral(L, "signal");
    } else {
      if (WIFEXITED(stat))
	stat = WEXITSTATUS(stat);
      if (stat == 0)
	setboolV(L->top++, 1);
      else
	setnilV(L->top++);
      lua_pushliteral(L, "exit");
    }
#else
    if (stat == 0)
      setboolV(L->top++, 1);
    else
      setnilV(L->top++);
    lua_pushliteral(L, "exit");
#endif
    setintV(L->top++, stat);
    return 3;
  }
  return luaL_fileresult(L, 0, NULL);
}